

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O1

int flatcc_verify_table_as_root_with_size
              (void *buf,size_t bufsiz,char *fid,flatcc_table_verifier_f *tvf)

{
  int iVar1;
  uint uVar2;
  bool bVar4;
  ulong local_40;
  flatcc_table_verifier_descriptor_t local_38;
  ulong uVar3;
  
  local_40 = bufsiz;
  iVar1 = flatcc_verify_buffer_header_with_size(buf,&local_40,fid);
  if (iVar1 == 0) {
    local_38.end = (flatbuffers_uoffset_t)local_40;
    local_38.ttl = 99;
    local_38.table = *(int *)((long)buf + 4) + 4;
    bVar4 = true;
    if ((4 < local_38.table) && ((ulong)local_38.table + 4 <= (local_40 & 0xffffffff))) {
      bVar4 = (local_38.table & 3) != 0;
    }
    if (bVar4) {
      iVar1 = 0xf;
    }
    else {
      uVar2 = local_38.table - *(int *)((long)buf + (ulong)local_38.table);
      uVar3 = (ulong)uVar2;
      iVar1 = 0x1d;
      if ((uVar2 & 1) == 0 && -1 < (int)uVar2) {
        if ((local_40 & 0xffffffff) < uVar3 + 2) {
          iVar1 = 0x1b;
        }
        else {
          local_38.vsize = *(ushort *)((long)buf + uVar3);
          iVar1 = 0x1e;
          if ((local_38.vsize & 1) == 0 && uVar2 + local_38.vsize <= local_38.end) {
            if (local_38.vsize < 4) {
              iVar1 = 0x1c;
            }
            else {
              local_38.tsize = *(ushort *)((long)buf + uVar3 + 2);
              if (local_38.end - local_38.table < (uint)local_38.tsize) {
                iVar1 = 0x14;
              }
              else {
                local_38.vtable = (void *)(uVar3 + (long)buf);
                local_38.buf = buf;
                iVar1 = (*tvf)(&local_38);
              }
            }
          }
        }
      }
    }
  }
  else {
    iVar1 = flatcc_verify_buffer_header_with_size(buf,&local_40,fid);
  }
  return iVar1;
}

Assistant:

int flatcc_verify_table_as_root_with_size(const void *buf, size_t bufsiz, const char *fid, flatcc_table_verifier_f *tvf)
{
    check_result(flatcc_verify_buffer_header_with_size(buf, &bufsiz, fid));
    return verify_table(buf, (uoffset_t)bufsiz, uoffset_size, read_uoffset(buf, uoffset_size), FLATCC_VERIFIER_MAX_LEVELS, tvf);
}